

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_encoder.c
# Opt level: O0

int encode_frame(aom_codec_ctx_t *codec,aom_image_t *img,int frame_index,int flags,
                AvxVideoWriter *writer)

{
  aom_codec_err_t aVar1;
  uint uVar2;
  int iVar3;
  aom_codec_cx_pkt_t *writer_00;
  undefined4 in_ECX;
  undefined4 in_EDX;
  aom_codec_ctx_t *in_RSI;
  aom_codec_ctx_t *in_R8;
  int keyframe;
  aom_codec_err_t res;
  aom_codec_cx_pkt_t *pkt;
  aom_codec_iter_t iter;
  int got_pkts;
  size_t in_stack_ffffffffffffffb8;
  undefined4 uVar4;
  char *pcVar5;
  aom_codec_ctx_t *ctx;
  uint in_stack_ffffffffffffffd8;
  int iVar6;
  
  iVar6 = 0;
  ctx = (aom_codec_ctx_t *)0x0;
  pcVar5 = (char *)0x0;
  aVar1 = aom_codec_encode(in_RSI,(aom_image_t *)CONCAT44(in_EDX,in_ECX),(aom_codec_pts_t)in_R8,
                           (ulong)in_stack_ffffffffffffffd8,0);
  if (aVar1 != AOM_CODEC_OK) {
    die_codec(ctx,pcVar5);
  }
  uVar4 = 0;
  while( true ) {
    do {
      writer_00 = aom_codec_get_cx_data
                            (in_R8,(aom_codec_iter_t *)CONCAT44(iVar6,in_stack_ffffffffffffffd8));
      if (writer_00 == (aom_codec_cx_pkt_t *)0x0) {
        return iVar6;
      }
      iVar6 = 1;
    } while (writer_00->kind != AOM_CODEC_CX_FRAME_PKT);
    uVar2 = (uint)(((writer_00->data).frame.flags & 1) != 0);
    iVar3 = aom_video_writer_write_frame
                      ((AvxVideoWriter *)writer_00,(uint8_t *)CONCAT44(uVar4,uVar2),
                       in_stack_ffffffffffffffb8,0x119174);
    if (iVar3 == 0) break;
    pcVar5 = ".";
    if (uVar2 != 0) {
      pcVar5 = "K";
    }
    printf(pcVar5);
    fflush(_stdout);
  }
  die_codec(ctx,(char *)writer_00);
}

Assistant:

static int encode_frame(aom_codec_ctx_t *codec, aom_image_t *img,
                        int frame_index, int flags, AvxVideoWriter *writer) {
  int got_pkts = 0;
  aom_codec_iter_t iter = NULL;
  const aom_codec_cx_pkt_t *pkt = NULL;
  const aom_codec_err_t res =
      aom_codec_encode(codec, img, frame_index, 1, flags);
  if (res != AOM_CODEC_OK) die_codec(codec, "Failed to encode frame");

  while ((pkt = aom_codec_get_cx_data(codec, &iter)) != NULL) {
    got_pkts = 1;

    if (pkt->kind == AOM_CODEC_CX_FRAME_PKT) {
      const int keyframe = (pkt->data.frame.flags & AOM_FRAME_IS_KEY) != 0;
      if (!aom_video_writer_write_frame(writer, pkt->data.frame.buf,
                                        pkt->data.frame.sz,
                                        pkt->data.frame.pts)) {
        die_codec(codec, "Failed to write compressed frame");
      }
      printf(keyframe ? "K" : ".");
      fflush(stdout);
    }
  }

  return got_pkts;
}